

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::PoolingLayerParams::ByteSizeLong(PoolingLayerParams *this)

{
  uint32 uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  size_t sVar11;
  int index;
  
  uVar4 = (this->kernelsize_).current_size_;
  uVar7 = 0;
  if ((int)uVar4 < 1) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      puVar5 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->kernelsize_,(int)uVar7);
      lVar9 = 0x3f;
      if ((*puVar5 | 1) != 0) {
        for (; (*puVar5 | 1) >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      lVar8 = lVar8 + (ulong)((int)lVar9 * 9 + 0x49U >> 6);
      uVar10 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar10;
    } while (uVar4 != uVar10);
    if (lVar8 == 0) {
      lVar8 = 0;
      uVar7 = 0;
    }
    else if ((int)(uint)lVar8 < 0) {
      uVar7 = 0xb;
    }
    else {
      uVar4 = (uint)lVar8 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
  }
  this->_kernelsize_cached_byte_size_ = (int)lVar8;
  lVar8 = uVar7 + lVar8;
  iVar2 = (this->stride_).current_size_;
  index = 0;
  if (iVar2 < 1) {
LAB_004885b5:
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    do {
      puVar5 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->stride_,index);
      lVar3 = 0x3f;
      if ((*puVar5 | 1) != 0) {
        for (; (*puVar5 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      lVar9 = lVar9 + (ulong)((int)lVar3 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar2 != index);
    if (lVar9 == 0) goto LAB_004885b5;
    if ((int)(uint)lVar9 < 0) {
      uVar7 = 0xc;
    }
    else {
      uVar4 = (uint)lVar9 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 2);
    }
    lVar8 = lVar8 + uVar7;
  }
  this->_stride_cached_byte_size_ = (int)lVar9;
  sVar11 = lVar8 + lVar9;
  uVar4 = this->type_;
  if (uVar4 != 0) {
    if ((int)uVar4 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    sVar11 = sVar11 + uVar7;
  }
  sVar6 = sVar11 + 3;
  if (this->avgpoolexcludepadding_ == false) {
    sVar6 = sVar11;
  }
  sVar11 = sVar6 + 3;
  if (this->globalpooling_ == false) {
    sVar11 = sVar6;
  }
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 0x20) {
    sVar6 = PoolingLayerParams_ValidCompletePadding::ByteSizeLong
                      ((this->PoolingPaddingType_).includelastpixel_);
  }
  else {
    if (uVar1 == 0x1f) {
      uVar4 = ((this->PoolingPaddingType_).same_)->asymmetrymode_;
      if (uVar4 == 0) {
        uVar7 = 0;
      }
      else if ((int)uVar4 < 0) {
        uVar7 = 0xb;
      }
      else {
        iVar2 = 0x1f;
        if ((uVar4 | 1) != 0) {
          for (; (uVar4 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      ((this->PoolingPaddingType_).same_)->_cached_size_ = (int)uVar7;
      sVar11 = sVar11 + uVar7 + 3;
      goto LAB_00488679;
    }
    if (uVar1 != 0x1e) goto LAB_00488679;
    sVar6 = ValidPadding::ByteSizeLong((this->PoolingPaddingType_).valid_);
  }
  uVar4 = (uint)sVar6 | 1;
  iVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar11 = sVar11 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
LAB_00488679:
  this->_cached_size_ = (int)sVar11;
  return sVar11;
}

Assistant:

size_t PoolingLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.PoolingLayerParams)
  size_t total_size = 0;

  // repeated uint64 kernelSize = 10;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->kernelsize_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _kernelsize_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 stride = 20;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->stride_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _stride_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.PoolingLayerParams.PoolingType type = 1;
  if (this->type() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
  }

  // bool avgPoolExcludePadding = 50;
  if (this->avgpoolexcludepadding() != 0) {
    total_size += 2 + 1;
  }

  // bool globalPooling = 60;
  if (this->globalpooling() != 0) {
    total_size += 2 + 1;
  }

  switch (PoolingPaddingType_case()) {
    // .CoreML.Specification.ValidPadding valid = 30;
    case kValid: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PoolingPaddingType_.valid_);
      break;
    }
    // .CoreML.Specification.SamePadding same = 31;
    case kSame: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PoolingPaddingType_.same_);
      break;
    }
    // .CoreML.Specification.PoolingLayerParams.ValidCompletePadding includeLastPixel = 32;
    case kIncludeLastPixel: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PoolingPaddingType_.includelastpixel_);
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}